

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

cl_program __thiscall
CLIntercept::createProgramWithBuiltinKernels(CLIntercept *this,cl_context context)

{
  mapped_type *ppSVar1;
  cl_program p_Var2;
  cl_context local_20;
  
  local_20 = context;
  std::mutex::lock(&this->m_Mutex);
  ppSVar1 = std::
            map<_cl_context_*,_CLIntercept::SBuiltinKernelOverrides_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SBuiltinKernelOverrides_*>_>_>
            ::operator[](&this->m_BuiltinKernelOverridesMap,&local_20);
  if (*ppSVar1 == (mapped_type)0x0) {
    p_Var2 = (cl_program)0x0;
  }
  else {
    p_Var2 = (*ppSVar1)->Program;
    (*(this->m_Dispatch).clRetainProgram)(p_Var2);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return p_Var2;
}

Assistant:

cl_program CLIntercept::createProgramWithBuiltinKernels(
    cl_context context )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_program  program = NULL;

    SBuiltinKernelOverrides*    pOverrides = m_BuiltinKernelOverridesMap[ context ];
    if( pOverrides )
    {
        program = pOverrides->Program;
        dispatch().clRetainProgram( program );
    }

    return program;
}